

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O1

t_int * voutlet_perform(t_int *w)

{
  long lVar1;
  t_int tVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  float *pfVar7;
  float *pfVar8;
  
  lVar1 = w[1];
  tVar2 = w[3];
  pfVar5 = *(float **)(lVar1 + 0x60);
  if ((int)tVar2 != 0) {
    lVar3 = w[2];
    pfVar4 = *(float **)(lVar1 + 0x50);
    lVar6 = 0;
    pfVar8 = pfVar5;
    do {
      pfVar7 = pfVar8 + 1;
      *pfVar8 = *(float *)(lVar3 + lVar6 * 4) + *pfVar8;
      if (pfVar7 == pfVar4) {
        pfVar7 = *(float **)(lVar1 + 0x48);
      }
      lVar6 = lVar6 + 1;
      pfVar8 = pfVar7;
    } while ((int)tVar2 != (int)lVar6);
  }
  pfVar5 = pfVar5 + *(int *)(lVar1 + 0x68);
  if (*(float **)(lVar1 + 0x50) <= pfVar5) {
    pfVar5 = *(float **)(lVar1 + 0x48);
  }
  *(float **)(lVar1 + 0x60) = pfVar5;
  return w + 4;
}

Assistant:

t_int *voutlet_perform(t_int *w)
{
    t_voutlet *x = (t_voutlet *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    t_sample *out = x->x_write, *outwas = out;
    while (n--)
    {
        *out++ += *in++;
        if (out == x->x_endbuf) out = x->x_buf;
    }
    outwas += x->x_hop;
    if (outwas >= x->x_endbuf) outwas = x->x_buf;
    x->x_write = outwas;
    return (w+4);
}